

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O2

SUNErrCode
SUNAdjointCheckpointScheme_LoadVector
          (SUNAdjointCheckpointScheme_conflict self,suncountertype step_num,suncountertype stage_num
          ,int peek,N_Vector *out,sunrealtype *tout)

{
  SUNAdjointCheckpointSchemeLoadVectorFn UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = self->ops->loadvector;
  if (UNRECOVERED_JUMPTABLE != (SUNAdjointCheckpointSchemeLoadVectorFn)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(self,step_num,stage_num,peek,out,tout);
    return SVar1;
  }
  return -0x2701;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_LoadVector(SUNAdjointCheckpointScheme self,
                                                 suncountertype step_num,
                                                 suncountertype stage_num,
                                                 sunbooleantype peek,
                                                 N_Vector* out, sunrealtype* tout)
{
  SUNFunctionBegin(self->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);
  if (self->ops->loadvector)
  {
    SUNErrCode err = self->ops->loadvector(self, step_num, stage_num, peek, out,
                                           tout);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}